

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuckoocache.h
# Opt level: O2

array<unsigned_int,_8UL> * __thiscall
CuckooCache::cache<uint256,_SignatureCacheHasher>::compute_hashes
          (array<unsigned_int,_8UL> *__return_storage_ptr__,
          cache<uint256,_SignatureCacheHasher> *this,uint256 *e)

{
  long lVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = (ulong)this->size;
  __return_storage_ptr__->_M_elems[0] =
       (uint)(*(uint *)(e->super_base_blob<256U>).m_data._M_elems * uVar2 >> 0x20);
  __return_storage_ptr__->_M_elems[1] =
       (uint)(*(uint *)((e->super_base_blob<256U>).m_data._M_elems + 4) * uVar2 >> 0x20);
  __return_storage_ptr__->_M_elems[2] =
       (uint)(*(uint *)((e->super_base_blob<256U>).m_data._M_elems + 8) * uVar2 >> 0x20);
  __return_storage_ptr__->_M_elems[3] =
       (uint)(*(uint *)((e->super_base_blob<256U>).m_data._M_elems + 0xc) * uVar2 >> 0x20);
  __return_storage_ptr__->_M_elems[4] =
       (uint)(*(uint *)((e->super_base_blob<256U>).m_data._M_elems + 0x10) * uVar2 >> 0x20);
  __return_storage_ptr__->_M_elems[5] =
       (uint)(*(uint *)((e->super_base_blob<256U>).m_data._M_elems + 0x14) * uVar2 >> 0x20);
  __return_storage_ptr__->_M_elems[6] =
       (uint)(*(uint *)((e->super_base_blob<256U>).m_data._M_elems + 0x18) * uVar2 >> 0x20);
  __return_storage_ptr__->_M_elems[7] =
       (uint)(*(uint *)((e->super_base_blob<256U>).m_data._M_elems + 0x1c) * uVar2 >> 0x20);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

inline std::array<uint32_t, 8> compute_hashes(const Element& e) const
    {
        return {{FastRange32(hash_function.template operator()<0>(e), size),
                 FastRange32(hash_function.template operator()<1>(e), size),
                 FastRange32(hash_function.template operator()<2>(e), size),
                 FastRange32(hash_function.template operator()<3>(e), size),
                 FastRange32(hash_function.template operator()<4>(e), size),
                 FastRange32(hash_function.template operator()<5>(e), size),
                 FastRange32(hash_function.template operator()<6>(e), size),
                 FastRange32(hash_function.template operator()<7>(e), size)}};
    }